

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

void __thiscall OpenMD::MoleculeStamp::fillBondInfo(MoleculeStamp *this)

{
  int atomIndex;
  int atomIndex_00;
  pointer ppBVar1;
  long lVar2;
  pointer ppAVar3;
  AtomStamp *this_00;
  AtomStamp *this_01;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  lVar4 = 0;
  for (uVar5 = 0;
      ppBVar1 = (this->bondStamps_).
                super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->bondStamps_).
                            super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3);
      uVar5 = uVar5 + 1) {
    lVar2 = *(long *)((long)ppBVar1 + (lVar4 >> 0x1d));
    atomIndex = *(int *)(lVar2 + 0xa0);
    atomIndex_00 = *(int *)(lVar2 + 0xa4);
    ppAVar3 = (this->atomStamps_).
              super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    this_00 = ppAVar3[atomIndex];
    this_01 = ppAVar3[atomIndex_00];
    AtomStamp::addBond(this_00,(int)uVar5);
    AtomStamp::addBondedAtom(this_00,atomIndex_00);
    AtomStamp::addBond(this_01,(int)uVar5);
    AtomStamp::addBondedAtom(this_01,atomIndex);
    lVar4 = lVar4 + 0x100000000;
  }
  return;
}

Assistant:

void MoleculeStamp::fillBondInfo() {
    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      int a                = bondStamp->getA();
      int b                = bondStamp->getB();
      AtomStamp* atomA     = getAtomStamp(a);
      AtomStamp* atomB     = getAtomStamp(b);
      atomA->addBond(i);
      atomA->addBondedAtom(b);
      atomB->addBond(i);
      atomB->addBondedAtom(a);
    }
  }